

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O0

bool __thiscall
InsertProxyModel::moveRows
          (InsertProxyModel *this,QModelIndex *sourceParent,int sourceRow,int count,
          QModelIndex *destinationParent,int destinationChild)

{
  int iVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long *plVar7;
  QModelIndex local_98;
  QModelIndex local_80;
  QModelIndex local_68;
  QModelIndex local_50;
  int local_34;
  QModelIndex *pQStack_30;
  int destinationChild_local;
  QModelIndex *destinationParent_local;
  int count_local;
  int sourceRow_local;
  QModelIndex *sourceParent_local;
  InsertProxyModel *this_local;
  
  local_34 = destinationChild;
  pQStack_30 = destinationParent;
  destinationParent_local._0_4_ = count;
  destinationParent_local._4_4_ = sourceRow;
  _count_local = sourceParent;
  sourceParent_local = (QModelIndex *)this;
  bVar2 = QModelIndex::isValid(sourceParent);
  if ((bVar2) || (bVar2 = QModelIndex::isValid(pQStack_30), bVar2)) {
    return false;
  }
  lVar6 = QAbstractProxyModel::sourceModel();
  if (lVar6 == 0) {
    return false;
  }
  iVar4 = destinationParent_local._4_4_ + (int)destinationParent_local;
  plVar7 = (long *)QAbstractProxyModel::sourceModel();
  QModelIndex::QModelIndex(&local_50);
  iVar5 = (**(code **)(*plVar7 + 0x78))(plVar7,&local_50);
  iVar1 = local_34;
  if (iVar5 < iVar4) {
    return false;
  }
  plVar7 = (long *)QAbstractProxyModel::sourceModel();
  QModelIndex::QModelIndex(&local_68);
  iVar4 = (**(code **)(*plVar7 + 0x78))(plVar7,&local_68);
  if (iVar4 < iVar1) {
    return false;
  }
  plVar7 = (long *)QAbstractProxyModel::sourceModel();
  QModelIndex::QModelIndex(&local_80);
  iVar4 = destinationParent_local._4_4_;
  iVar1 = (int)destinationParent_local;
  QModelIndex::QModelIndex(&local_98);
  bVar3 = (**(code **)(*plVar7 + 0x118))(plVar7,&local_80,iVar4,iVar1,&local_98,local_34);
  return (bool)(bVar3 & 1);
}

Assistant:

bool InsertProxyModel::moveRows(const QModelIndex &sourceParent, int sourceRow, int count, const QModelIndex &destinationParent, int destinationChild)
{
    if (sourceParent.isValid() || destinationParent.isValid())
        return false;
    if (!sourceModel())
        return false;
    if (sourceRow + count > sourceModel()->rowCount())
        return false;
    if (destinationChild > sourceModel()->rowCount())
        return false;
    return sourceModel()->moveRows(QModelIndex(), sourceRow, count, QModelIndex(), destinationChild);
}